

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O0

int main(void)

{
  time_t tVar1;
  long in_FS_OFFSET;
  undefined1 auStack_118 [128];
  undefined1 auStack_98 [4];
  undefined4 local_94;
  undefined1 *local_90;
  uint local_84;
  int local_80;
  uint i_1;
  int r;
  uint i;
  unsigned_long __vla_expr0;
  uint local_68;
  undefined4 local_64;
  uint max_threads;
  pfx_table pfxt;
  
  __vla_expr0 = (unsigned_long)auStack_98;
  pfxt.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_64 = 0;
  local_68 = 0xf;
  _r = 0xf;
  local_90 = auStack_118;
  pfx_table_init((pfx_table *)&max_threads,(pfx_update_fp)0x0);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  for (i_1 = 0; i_1 < local_68; i_1 = i_1 + 1) {
    local_80 = rand();
    local_80 = local_80 / 0x2aaaaaaa;
    if (local_80 == 0) {
      pthread_create((pthread_t *)(local_90 + (ulong)i_1 * 8),(pthread_attr_t *)0x0,rec_add,
                     &max_threads);
    }
    else if (local_80 == 1) {
      pthread_create((pthread_t *)(local_90 + (ulong)i_1 * 8),(pthread_attr_t *)0x0,rec_del,
                     &max_threads);
    }
    else if (local_80 == 2) {
      pthread_create((pthread_t *)(local_90 + (ulong)i_1 * 8),(pthread_attr_t *)0x0,rec_val,
                     &max_threads);
    }
    printf("Started Thread %d\n",(ulong)i_1);
    usleep(200);
  }
  for (local_84 = 0; local_84 < local_68; local_84 = local_84 + 1) {
    pthread_join(*(pthread_t *)(local_90 + (ulong)local_84 * 8),(void **)0x0);
    printf("Thread %i returned\n",(ulong)local_84);
  }
  local_64 = 0;
  local_94 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != pfxt.lock._48_8_) {
    *(undefined8 *)(__vla_expr0 - 8) = 0x1024ed;
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int main(void)
{
	unsigned int max_threads = 15;
	struct pfx_table pfxt;
	pthread_t threads[max_threads];

	pfx_table_init(&pfxt, NULL);
	srand(time(NULL));

	for (unsigned int i = 0; i < max_threads; i++) {
		int r = rand() / (RAND_MAX / 3);

		if (r == 0)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_add, &pfxt);
		else if (r == 1)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_del, &pfxt);
		else if (r == 2)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_val, &pfxt);
		printf("Started Thread %d\n", i);
		usleep(200);
	}
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	return EXIT_SUCCESS;
}